

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaliperMetadataAccessInterface.cpp
# Opt level: O3

vector<cali::Attribute,_std::allocator<cali::Attribute>_> * __thiscall
cali::CaliperMetadataAccessInterface::find_attributes_with_prop
          (vector<cali::Attribute,_std::allocator<cali::Attribute>_> *__return_storage_ptr__,
          CaliperMetadataAccessInterface *this,int prop)

{
  pointer *ppAVar1;
  iterator __position;
  uint uVar2;
  undefined8 *puVar3;
  Attribute attr;
  vector<cali::Attribute,_std::allocator<cali::Attribute>_> vec;
  Attribute local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  long local_30;
  
  (*this->_vptr_CaliperMetadataAccessInterface[3])(&local_40);
  (__return_storage_ptr__->super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (puVar3 = local_40; puVar3 != local_38; puVar3 = puVar3 + 1) {
    local_48.m_node = (Node *)*puVar3;
    uVar2 = Attribute::properties(&local_48);
    if ((uVar2 & prop) != 0) {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cali::Attribute,std::allocator<cali::Attribute>>::
        _M_realloc_insert<cali::Attribute_const&>
                  ((vector<cali::Attribute,std::allocator<cali::Attribute>> *)__return_storage_ptr__
                   ,__position,&local_48);
      }
      else {
        (__position._M_current)->m_node = local_48.m_node;
        ppAVar1 = &(__return_storage_ptr__->
                   super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
    }
  }
  if (local_40 != (undefined8 *)0x0) {
    operator_delete(local_40,local_30 - (long)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Attribute> CaliperMetadataAccessInterface::find_attributes_with_prop(int prop) const
{
    std::vector<Attribute> vec = get_all_attributes();
    std::vector<Attribute> ret;

    for (Attribute attr : vec)
        if (attr.properties() & prop)
            ret.push_back(attr);

    return ret;
}